

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.cpp
# Opt level: O0

void __thiscall rw::free_managed(rw *this,void *p)

{
  MemoryBlock *mem;
  void *p_local;
  
  if (this != (rw *)0x0) {
    LLLink::remove((LLLink *)(this + -0x10),(char *)p);
    totalMemoryAllocated = totalMemoryAllocated - *(long *)(this + -0x30);
    free(*(void **)(this + -0x20));
  }
  return;
}

Assistant:

void
free_managed(void *p)
{
	MemoryBlock *mem;
	if(p == nil)
		return;
	mem = (MemoryBlock*)((uint8*)p-sizeof(MemoryBlock));
	mem->inAllocList.remove();
	totalMemoryAllocated -= mem->sz;
	free(mem->origPtr);
}